

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyNonFloatItems_helper
          (QGraphicsAnchorLayoutPrivate *this,AnchorData *ad,
          QSet<QGraphicsLayoutItem_*> *nonFloatingItemsIdentifiedSoFar)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  QGraphicsAnchorLayout *nonFloatingItemsIdentifiedSoFar_00;
  const_iterator o;
  AnchorData *in_RDX;
  QGraphicsAnchorLayoutPrivate *in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  AnchorData *d;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *__range2;
  QGraphicsAnchorLayout *q;
  const_iterator __end2;
  const_iterator __begin2;
  QGraphicsLayoutItem **in_stack_ffffffffffffffa0;
  QSet<QGraphicsLayoutItem_*> *in_stack_ffffffffffffffa8;
  const_iterator local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  nonFloatingItemsIdentifiedSoFar_00 = q_func(in_RDI);
  bVar1 = *(byte *)&(in_RSI->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                    cachedSizeHintsWithConstraints[0].ht;
  bVar2 = bVar1 & 3;
  if ((bVar1 & 3) == 0) {
    if (((in_RSI->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.cachedConstraint.ht
         != 0.0) &&
       ((QGraphicsAnchorLayout *)
        (in_RSI->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.cachedConstraint.ht
        != nonFloatingItemsIdentifiedSoFar_00)) {
      QSet<QGraphicsLayoutItem_*>::insert(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
  }
  else if (bVar2 == 1) {
    local_20[0].i = (AnchorData **)&DAT_aaaaaaaaaaaaaaaa;
    local_20[0] = QList<QtGraphicsAnchorLayout::AnchorData_*>::begin
                            ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI);
    o = QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI);
    while (bVar3 = QList<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator!=
                             (local_20,o), bVar3) {
      QList<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator*(local_20);
      identifyNonFloatItems_helper
                (in_RSI,in_RDX,(QSet<QGraphicsLayoutItem_*> *)nonFloatingItemsIdentifiedSoFar_00);
      QList<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator++(local_20);
    }
  }
  else if (bVar2 == 2) {
    identifyNonFloatItems_helper
              (in_RSI,in_RDX,(QSet<QGraphicsLayoutItem_*> *)nonFloatingItemsIdentifiedSoFar_00);
    identifyNonFloatItems_helper
              (in_RSI,in_RDX,(QSet<QGraphicsLayoutItem_*> *)nonFloatingItemsIdentifiedSoFar_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyNonFloatItems_helper(const AnchorData *ad, QSet<QGraphicsLayoutItem *> *nonFloatingItemsIdentifiedSoFar)
{
    Q_Q(QGraphicsAnchorLayout);

    switch(ad->type) {
    case AnchorData::Normal:
        if (ad->item && ad->item != q)
            nonFloatingItemsIdentifiedSoFar->insert(ad->item);
        break;
    case AnchorData::Sequential:
        for (const AnchorData *d : static_cast<const SequentialAnchorData *>(ad)->m_edges)
            identifyNonFloatItems_helper(d, nonFloatingItemsIdentifiedSoFar);
        break;
    case AnchorData::Parallel:
        identifyNonFloatItems_helper(static_cast<const ParallelAnchorData *>(ad)->firstEdge, nonFloatingItemsIdentifiedSoFar);
        identifyNonFloatItems_helper(static_cast<const ParallelAnchorData *>(ad)->secondEdge, nonFloatingItemsIdentifiedSoFar);
        break;
    }
}